

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall MCU::quantify(MCU *this)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  double dVar7;
  long lVar8;
  BLOCK (*paaaadVar9) [2] [2];
  long lVar10;
  BLOCK (*paaaadVar11) [2] [2];
  BLOCK (*paaaadVar12) [2] [2];
  ulong uVar13;
  int *piVar14;
  int i;
  long lVar15;
  ulong uVar16;
  BLOCK (*paaaadVar17) [2] [2];
  
  paaaadVar11 = this->mcu;
  lVar8 = 1;
  do {
    paaaadVar11 = paaaadVar11 + 1;
    bVar4 = subVector[lVar8].height;
    if ((ulong)bVar4 != 0) {
      bVar5 = subVector[lVar8].width;
      uVar13 = 0;
      paaaadVar12 = paaaadVar11;
      do {
        if ((ulong)bVar5 != 0) {
          bVar6 = subVector[lVar8].quant;
          uVar16 = 0;
          paaaadVar9 = paaaadVar12;
          do {
            lVar15 = 0;
            piVar14 = quantTable[bVar6];
            paaaadVar17 = paaaadVar9;
            do {
              lVar10 = 0;
              do {
                uVar3 = *(undefined8 *)(piVar14 + lVar10);
                pdVar1 = (*paaaadVar17)[0][0][0] + lVar10;
                dVar7 = pdVar1[1];
                pdVar2 = (*paaaadVar17)[0][0][0] + lVar10;
                *pdVar2 = *pdVar1 * (double)(int)uVar3;
                pdVar2[1] = dVar7 * (double)(int)((ulong)uVar3 >> 0x20);
                lVar10 = lVar10 + 2;
              } while (lVar10 != 8);
              lVar15 = lVar15 + 1;
              piVar14 = piVar14 + 8;
              paaaadVar17 = (BLOCK (*) [2] [2])((*paaaadVar17)[0][0] + 1);
            } while (lVar15 != 8);
            uVar16 = uVar16 + 1;
            paaaadVar9 = (BLOCK (*) [2] [2])((*paaaadVar9)[0] + 1);
          } while (uVar16 != bVar5);
        }
        uVar13 = uVar13 + 1;
        paaaadVar12 = (BLOCK (*) [2] [2])(*paaaadVar12 + 1);
      } while (uVar13 != bVar4);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  return;
}

Assistant:

void quantify() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] *= quantTable[subVector[id].quant][i*8 + j];
                        }
                    }
                }
            }
        }
    }